

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int deep_dump(nvamemtiming_conf *conf)

{
  FILE *__stream;
  int *in_RDI;
  uint8_t orig;
  FILE *outf;
  int i;
  char filename [21];
  color in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffbf;
  color in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint8_t index;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  char local_28 [24];
  int *local_10;
  int local_4;
  
  local_10 = in_RDI;
  if ((*(byte *)(in_RDI + 4) == 0xffffffff) || (*(byte *)((long)in_RDI + 0x11) == 0xffffffff)) {
    sprintf(local_28,"regs_timing_deep_%i_%i",(ulong)*(byte *)(in_RDI + 4),
            (ulong)*(byte *)((long)in_RDI + 0x11));
  }
  else {
    sprintf(local_28,"regs_timing_deep");
  }
  __stream = fopen(local_28,"wb");
  if (__stream == (FILE *)0x0) {
    perror("Open regs_timing_deep");
    local_4 = 1;
  }
  else {
    if (nva_cards[*local_10].card_type < 0xc0) {
      timing_value_types = nv40_timing_value_types;
    }
    else {
      timing_value_types = nvc0_timing_value_types;
    }
    if ((char)local_10[4] == -1) {
      *(undefined1 *)(local_10 + 4) = 0;
    }
    if (*(char *)((long)local_10 + 0x11) == -1) {
      *(char *)((long)local_10 + 0x11) = (char)*(undefined2 *)((long)local_10 + 0x2e);
    }
    fprintf(_stderr,"Deep mode: Will iterate between %i and %i\n",(ulong)*(byte *)(local_10 + 4),
            (ulong)*(byte *)((long)local_10 + 0x11));
    launch((nvamemtiming_conf *)__stream,
           (FILE *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
           in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8);
    for (iVar1 = 0; iVar1 < (int)(uint)*(ushort *)((long)local_10 + 0x2e); iVar1 = iVar1 + 1) {
      index = *(uint8_t *)
               (*(long *)(local_10 + 8) + (long)(int)((uint)*(ushort *)(local_10 + 0xb) + iVar1));
      if ((timing_value_types[iVar1] == VALUE) ||
         ((timing_value_types[iVar1] == EMPTY && (index != '\0')))) {
        if ((timing_value_types[iVar1] == EMPTY) && (index != '\0')) {
          fprintf(__stream,"WARNING: The following entry was supposed to be unused!\n");
        }
        iterate_values((nvamemtiming_conf *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                       (FILE *)__stream,index,in_stack_ffffffffffffffc0);
      }
      else if (timing_value_types[iVar1] == BITFIELD) {
        iterate_bitfield((nvamemtiming_conf *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                         (FILE *)__stream,index,in_stack_ffffffffffffffc0);
      }
      else if (timing_value_types[iVar1] == EMPTY) {
        fprintf(__stream,"timing entry [%u/%u] is supposed empty\n\n",(ulong)(iVar1 + 1),
                (ulong)*(ushort *)((long)local_10 + 0x2e));
      }
      *(uint8_t *)(*(long *)(local_10 + 8) + (long)(int)((uint)*(ushort *)(local_10 + 0xb) + iVar1))
           = index;
    }
    fclose(__stream);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
deep_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == -1 ||  conf->range.end == -1)
		sprintf(filename, "regs_timing_deep_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing_deep");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing_deep");
		return 1;
	}

	if (nva_cards[conf->cnum].card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length;

	fprintf(stderr, "Deep mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = 0; i < conf->vbios.timing_entry_length; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			iterate_values(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}